

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL __thiscall
Js::CustomExternalWrapperObject::GetPropertyDescriptorTrap
          (CustomExternalWrapperObject *this,PropertyId propertyId,
          PropertyDescriptor *resultDescriptor,ScriptContext *requestContext)

{
  code *pcVar1;
  anon_class_48_6_f89e725c implicitCall;
  TypeId TVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  ScriptContext *pSVar6;
  ThreadContext *this_00;
  JsGetterSetterInterceptor *pJVar7;
  void **ppvVar8;
  JavascriptLibrary *pJVar9;
  Var pvVar10;
  undefined4 *puVar11;
  BOOL toProperty;
  TypeId getResultTypeId;
  Var getResult;
  Var propertyName;
  Var propertyNameNumericValue;
  Var isPropertyNameNumeric;
  Var value;
  Var setter;
  Var getter;
  JavascriptFunction *gOPDMethod;
  CustomExternalWrapperType *type;
  RecyclableObject *targetObj;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  PropertyDescriptor *resultDescriptor_local;
  CustomExternalWrapperObject *pCStack_30;
  PropertyId propertyId_local;
  CustomExternalWrapperObject *this_local;
  Var local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  threadContext = (ThreadContext *)requestContext;
  requestContext_local = (ScriptContext *)resultDescriptor;
  resultDescriptor_local._4_4_ = propertyId;
  pCStack_30 = this;
  pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_00 = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(this_00,0xc00,pSVar6,(PVOID)0x0);
  targetObj = (RecyclableObject *)ScriptContext::GetThreadContext((ScriptContext *)threadContext);
  BVar4 = EnsureInitialized(this,(ScriptContext *)threadContext);
  if (BVar4 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    type = (CustomExternalWrapperType *)this;
    gOPDMethod = (JavascriptFunction *)GetExternalType(this);
    getter = (Var)0x0;
    pJVar7 = CustomExternalWrapperType::GetJsGetterSetterInterceptor
                       ((CustomExternalWrapperType *)gOPDMethod);
    ppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&pJVar7->getOwnPropertyDescriptorTrap);
    if (*ppvVar8 != (void *)0x0) {
      pJVar7 = CustomExternalWrapperType::GetJsGetterSetterInterceptor
                         ((CustomExternalWrapperType *)gOPDMethod);
      ppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&pJVar7->getOwnPropertyDescriptorTrap);
      getter = VarTo<Js::JavascriptFunction>(*ppvVar8);
    }
    pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    bVar3 = ScriptContext::IsHeapEnumInProgress(pSVar6);
    if (bVar3) {
      this_local._4_4_ = 0;
    }
    else if (getter == (Var)0x0) {
      BVar4 = Js::JavascriptOperators::GetOwnAccessors
                        (this,resultDescriptor_local._4_4_,&setter,&value,
                         (ScriptContext *)threadContext);
      if (BVar4 == 0) {
        isPropertyNameNumeric = (Var)0x0;
        BVar4 = Js::JavascriptOperators::GetOwnProperty
                          (this,resultDescriptor_local._4_4_,&isPropertyNameNumeric,
                           (ScriptContext *)threadContext,(PropertyValueInfo *)0x0);
        if (BVar4 == 0) {
          return 0;
        }
        if (isPropertyNameNumeric != (Var)0x0) {
          PropertyDescriptor::SetValue
                    ((PropertyDescriptor *)requestContext_local,isPropertyNameNumeric);
        }
        pSVar6 = requestContext_local;
        iVar5 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x30])
                          (this,(ulong)resultDescriptor_local._4_4_);
        PropertyDescriptor::SetWritable((PropertyDescriptor *)pSVar6,iVar5 != 0);
      }
      else {
        if (setter == (Var)0x0) {
          pJVar9 = ScriptContext::GetLibrary((ScriptContext *)threadContext);
          setter = JavascriptLibraryBase::GetUndefined(&pJVar9->super_JavascriptLibraryBase);
        }
        PropertyDescriptor::SetGetter((PropertyDescriptor *)requestContext_local,setter);
        if (value == (Var)0x0) {
          pJVar9 = ScriptContext::GetLibrary((ScriptContext *)threadContext);
          value = JavascriptLibraryBase::GetUndefined(&pJVar9->super_JavascriptLibraryBase);
        }
        PropertyDescriptor::SetSetter((PropertyDescriptor *)requestContext_local,value);
      }
      pSVar6 = requestContext_local;
      iVar5 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x31])
                        (this,(ulong)resultDescriptor_local._4_4_);
      PropertyDescriptor::SetConfigurable((PropertyDescriptor *)pSVar6,iVar5 != 0);
      pSVar6 = requestContext_local;
      iVar5 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x32])
                        (this,(ulong)resultDescriptor_local._4_4_);
      PropertyDescriptor::SetEnumerable((PropertyDescriptor *)pSVar6,iVar5 != 0);
      this_local._4_4_ = 1;
    }
    else {
      pvVar10 = GetName(this,(ScriptContext *)threadContext,resultDescriptor_local._4_4_,
                        &propertyNameNumericValue,&propertyName);
      bVar3 = VarIs<Js::JavascriptString>(pvVar10);
      if ((!bVar3) && (bVar3 = VarIs<Js::JavascriptSymbol>(pvVar10), !bVar3)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                    ,0x1e1,
                                    "(Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName))"
                                    ,
                                    "Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName)"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      implicitCall.gOPDMethod = (JavascriptFunction *)getter;
      implicitCall.threadContext = (ThreadContext *)targetObj;
      implicitCall.targetObj = (RecyclableObject *)type;
      implicitCall.propertyName = pvVar10;
      implicitCall.isPropertyNameNumeric = propertyNameNumericValue;
      implicitCall.propertyNameNumericValue = propertyName;
      pvVar10 = ThreadContext::
                ExecuteImplicitCall<Js::CustomExternalWrapperObject::GetPropertyDescriptorTrap(int,Js::PropertyDescriptor*,Js::ScriptContext*)::__0>
                          ((ThreadContext *)targetObj,(RecyclableObject *)getter,
                           ImplicitCall_Accessor,implicitCall);
      local_20 = pvVar10;
      if (pvVar10 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      bVar3 = TaggedInt::Is(local_20);
      if (bVar3) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
        if (bVar3) {
          local_18 = TypeIds_Number;
        }
        else {
          pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
          if (pRStack_10 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          local_14 = RecyclableObject::GetTypeId(pRStack_10);
          if ((0x57 < (int)local_14) &&
             (BVar4 = RecyclableObject::IsExternal(pRStack_10), BVar4 == 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          local_18 = local_14;
        }
      }
      TVar2 = local_18;
      bVar3 = StaticType::Is(local_18);
      if ((bVar3) && (TVar2 != TypeIds_Undefined)) {
        JavascriptError::ThrowTypeError
                  ((ScriptContext *)threadContext,-0x7ff5ec71,L"getOwnPropertyDescriptor");
      }
      BVar4 = Js::JavascriptOperators::ToPropertyDescriptor
                        (pvVar10,(PropertyDescriptor *)requestContext_local,
                         (ScriptContext *)threadContext);
      Js::JavascriptOperators::CompletePropertyDescriptor
                ((PropertyDescriptor *)requestContext_local,(PropertyDescriptor *)0x0,
                 (ScriptContext *)threadContext);
      this_local._4_4_ = BVar4;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL CustomExternalWrapperObject::GetPropertyDescriptorTrap(Js::PropertyId propertyId, Js::PropertyDescriptor* resultDescriptor, Js::ScriptContext* requestContext)
{
    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    ThreadContext* threadContext = requestContext->GetThreadContext();

    if (!this->EnsureInitialized(requestContext))
    {
        return FALSE;
    }

    Js::RecyclableObject * targetObj = this;

    CustomExternalWrapperType * type = this->GetExternalType();
    Js::JavascriptFunction* gOPDMethod = nullptr;
    if (type->GetJsGetterSetterInterceptor()->getOwnPropertyDescriptorTrap != nullptr)
    {
        gOPDMethod = Js::VarTo<JavascriptFunction>(type->GetJsGetterSetterInterceptor()->getOwnPropertyDescriptorTrap);
    }

    if (GetScriptContext()->IsHeapEnumInProgress())
    {
        return FALSE;
    }

    if (nullptr == gOPDMethod)
    {
        Var getter, setter;
        if (false == JavascriptOperators::GetOwnAccessors(this, propertyId, &getter, &setter, requestContext))
        {
            Var value = nullptr;
            if (false == JavascriptOperators::GetOwnProperty(this, propertyId, &value, requestContext, nullptr))
            {
                return FALSE;
            }
            if (nullptr != value)
            {
                resultDescriptor->SetValue(value);
            }

            resultDescriptor->SetWritable(FALSE != this->IsWritable(propertyId));
        }
        else
        {
            if (nullptr == getter)
            {
                getter = requestContext->GetLibrary()->GetUndefined();
            }
            resultDescriptor->SetGetter(getter);

            if (nullptr == setter)
            {
                setter = requestContext->GetLibrary()->GetUndefined();
            }
            resultDescriptor->SetSetter(setter);
        }

        resultDescriptor->SetConfigurable(FALSE != this->IsConfigurable(propertyId));
        resultDescriptor->SetEnumerable(FALSE != this->IsEnumerable(propertyId));
        return TRUE;
    }

    Js::Var isPropertyNameNumeric;
    Js::Var propertyNameNumericValue;
    Js::Var propertyName = GetName(requestContext, propertyId, &isPropertyNameNumeric, &propertyNameNumericValue);

    Assert(Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName));

    Js::Var getResult = threadContext->ExecuteImplicitCall(gOPDMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, gOPDMethod, Js::CallInfo(Js::CallFlags_Value, 4), targetObj, propertyName, isPropertyNameNumeric, propertyNameNumericValue);
    });

    Js::TypeId getResultTypeId = Js::JavascriptOperators::GetTypeId(getResult);
    if (Js::StaticType::Is(getResultTypeId) && getResultTypeId != Js::TypeIds_Undefined)
    {
        Js::JavascriptError::ThrowTypeError(requestContext, JSERR_NeedObject, _u("getOwnPropertyDescriptor"));
    }

    BOOL toProperty = Js::JavascriptOperators::ToPropertyDescriptor(getResult, resultDescriptor, requestContext);
    Js::JavascriptOperators::CompletePropertyDescriptor(resultDescriptor, nullptr, requestContext);
    return toProperty;
}